

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  int iVar6;
  sysbvm_tuple_t right;
  size_t sVar7;
  
  if (stringSize != 0) {
    sVar7 = 1;
    if (*string == '-') {
      bVar3 = true;
      goto LAB_00114114;
    }
    if (*string == '+') {
      bVar3 = false;
      goto LAB_00114114;
    }
  }
  bVar3 = false;
  sVar7 = 0;
LAB_00114114:
  sVar5 = 1;
  if (sVar7 < stringSize) {
    right = 0xa1;
    bVar2 = 1;
    sVar4 = sVar5;
    do {
      cVar1 = string[sVar7];
      iVar6 = (int)cVar1;
      if ((byte)(cVar1 - 0x30U) < 10) {
        sVar5 = (sysbvm_tuple_t)(iVar6 * 0x10 - 0x2ff);
LAB_001141a6:
        iVar6 = sysbvm_integer_compare(context,sVar5,right);
        if (-1 < iVar6) {
          sysbvm_error("Digit value is beyond the radix.");
        }
        sVar4 = sysbvm_integer_multiply(context,sVar4,right);
        sVar5 = sysbvm_integer_add(context,sVar4,sVar5);
      }
      else {
        if (!(bool)((byte)(cVar1 + 0x85U) < 0xe6 | bVar2)) {
          sVar5 = (sysbvm_tuple_t)(iVar6 * 0x10 - 0x56f);
          goto LAB_001141a6;
        }
        if (!(bool)((byte)(cVar1 + 0xa5U) < 0xe6 | bVar2)) {
          sVar5 = (sysbvm_tuple_t)(iVar6 * 0x10 - 0x36f);
          goto LAB_001141a6;
        }
        sVar5 = sVar4;
        if (cVar1 != '_') {
          if ((bool)(cVar1 == 'r' & bVar2)) {
            bVar2 = 0;
            sVar5 = 1;
            right = sVar4;
          }
          else {
            sysbvm_error("Invalid integer literal.");
          }
        }
      }
      sVar7 = sVar7 + 1;
      sVar4 = sVar5;
    } while (stringSize != sVar7);
  }
  if (!bVar3) {
    return sVar5;
  }
  sVar5 = sysbvm_integer_negated(context,sVar5);
  return sVar5;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    size_t index = 0;
    bool isNegative = false;

    // Parse the sign.
    if(index < stringSize)
    {
        if(string[index] == '-')
        {
            isNegative = true;
            ++index;
        }
        else if(string[index] == '+')
        {
            ++index;
        }
    }

    sysbvm_tuple_t result = sysbvm_tuple_integer_encodeSmall(0);
    sysbvm_tuple_t radix = sysbvm_tuple_integer_encodeSmall(10);
    bool canParseRadix = true;
    for(; index < stringSize; ++index)
    {
        char digit = string[index];
        if('0' <= digit && digit <= '9')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - '0');
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");

            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'a' <= digit && digit <= 'z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'a' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'A' <= digit && digit <= 'Z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'A' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if('_' == digit)
        {
            // Ignore it
        }
        else if(canParseRadix && ('r' == digit || 'r' == digit))
        {
            // We just saw the radix.
            radix = result;
            result = sysbvm_tuple_integer_encodeSmall(0);
            canParseRadix = false;
        }
        else
        {
            sysbvm_error("Invalid integer literal.");
        }
    }

    if(isNegative)
        return sysbvm_integer_negated(context, result);

    return result;
}